

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::ApplyMasterScale(Discreet3DSImporter *this,aiScene *pScene)

{
  uint uVar1;
  aiMatrix4x4t<float> local_40;
  
  uVar1 = -(uint)(this->mMasterScale != 0.0);
  local_40.a1 = (float)(~uVar1 & 0x3f800000 | (uint)(1.0 / this->mMasterScale) & uVar1);
  this->mMasterScale = local_40.a1;
  local_40.a2 = 0.0;
  local_40.a3 = 0.0;
  local_40.a4 = 0.0;
  local_40.b1 = 0.0;
  local_40.b3 = 0.0;
  local_40.b4 = 0.0;
  local_40.c1 = 0.0;
  local_40.c2 = 0.0;
  local_40.c4 = 0.0;
  local_40.d1 = 0.0;
  local_40.d2 = 0.0;
  local_40.d3 = 0.0;
  local_40.d4 = 1.0;
  local_40.b2 = local_40.a1;
  local_40.c3 = local_40.a1;
  aiMatrix4x4t<float>::operator*=(&pScene->mRootNode->mTransformation,&local_40);
  return;
}

Assistant:

void Discreet3DSImporter::ApplyMasterScale(aiScene* pScene)
{
    // There are some 3DS files with a zero scaling factor
    if (!mMasterScale)mMasterScale = 1.0f;
    else mMasterScale = 1.0f / mMasterScale;

    // Construct an uniform scaling matrix and multiply with it
    pScene->mRootNode->mTransformation *= aiMatrix4x4(
        mMasterScale,0.0f, 0.0f, 0.0f,
        0.0f, mMasterScale,0.0f, 0.0f,
        0.0f, 0.0f, mMasterScale,0.0f,
        0.0f, 0.0f, 0.0f, 1.0f);

    // Check whether a scaling track is assigned to the root node.
}